

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O2

void __thiscall
QuasispeciesEdgeCalculator::QuasispeciesEdgeCalculator
          (QuasispeciesEdgeCalculator *this,double Q,double edge_quasi_cutoff,double overlap,
          bool frameshift_merge,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *simpson_map,double edge_quasi_cutoff_single,double overlap_single,
          double edge_quasi_cutoff_mixed)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_EdgeCalculator)._vptr_EdgeCalculator =
       (_func_int **)&PTR__QuasispeciesEdgeCalculator_001d6e20;
  p_Var1 = &(this->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header;
  (this->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Q = Q;
  this->EDGE_QUASI_CUTOFF = edge_quasi_cutoff;
  this->EDGE_QUASI_CUTOFF_SINGLE = edge_quasi_cutoff_single;
  this->EDGE_QUASI_CUTOFF_MIXED = edge_quasi_cutoff_mixed;
  this->MIN_OVERLAP_CLIQUES = overlap;
  this->MIN_OVERLAP_SINGLE = overlap_single;
  this->FRAMESHIFT_MERGE = frameshift_merge;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::operator=(&(this->SIMPSON_MAP)._M_t,&simpson_map->_M_t);
  return;
}

Assistant:

QuasispeciesEdgeCalculator::QuasispeciesEdgeCalculator(double Q, double edge_quasi_cutoff, double overlap, bool frameshift_merge, map<int, double>& simpson_map, double edge_quasi_cutoff_single, double overlap_single, double edge_quasi_cutoff_mixed) {
    this->Q = Q;
    this->EDGE_QUASI_CUTOFF = edge_quasi_cutoff;
    this->EDGE_QUASI_CUTOFF_SINGLE = edge_quasi_cutoff_single;
    this->EDGE_QUASI_CUTOFF_MIXED = edge_quasi_cutoff_mixed;
    this->MIN_OVERLAP_CLIQUES = overlap;
    this->MIN_OVERLAP_SINGLE = overlap_single;
    this->FRAMESHIFT_MERGE = frameshift_merge;
    this->SIMPSON_MAP = simpson_map;
}